

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNMod::gen_code(CTPNMod *this,int discard,int for_condition)

{
  int iVar1;
  CTcPrsNodeBase *this_00;
  CTcPrsNode *pCVar2;
  CTcGenTarg *pCVar3;
  int iVar4;
  
  iVar4 = CTcPrsNodeBase::is_const_int
                    (&((this->super_CTPNBin).super_CTPNBinBase.right_)->super_CTcPrsNodeBase,1);
  this_00 = &((this->super_CTPNBin).super_CTPNBinBase.left_)->super_CTcPrsNodeBase;
  if (iVar4 == 0) {
    iVar4 = CTcPrsNodeBase::is_const_int(this_00,0);
    if (iVar4 == 0) {
      CTPNBin::gen_binary(&this->super_CTPNBin,'+',discard,0);
      return;
    }
    pCVar2 = (this->super_CTPNBin).super_CTPNBinBase.right_;
    (**(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(pCVar2,1,1);
    CTcGenTarg::write_op(G_cg,'\x01');
  }
  else {
    (**this_00->_vptr_CTcPrsNodeBase)(this_00,discard,(ulong)(uint)for_condition);
    CTcGenTarg::write_op(G_cg,'\x01');
  }
  pCVar3 = G_cg;
  iVar1 = G_cg->sp_depth_;
  iVar4 = iVar1 + 1;
  G_cg->sp_depth_ = iVar4;
  if (pCVar3->max_sp_depth_ <= iVar1) {
    pCVar3->max_sp_depth_ = iVar4;
  }
  return;
}

Assistant:

void CTPNMod::gen_code(int discard, int for_condition)
{
    /* if dividing by 1, we can skip the whole thing (except side effects) */
    if (right_->is_const_int(1))
    {
        /* 
         *   simply generate the left side for side effects; actually
         *   doing the arithmetic has no effect 
         */
        left_->gen_code(discard, for_condition);

        /* the result is zero */
        G_cg->write_op(OPC_PUSH_0);
        G_cg->note_push();
        return;
    }

    /* if the left side is zero, the result is always zero */
    if (left_->is_const_int(0))
    {
        /* evaluate the right for side effects, but discard the result */
        right_->gen_code(TRUE, TRUE);

        /* the result is zero */
        G_cg->write_op(OPC_PUSH_0);
        G_cg->note_push();
        return;
    }

    /* use generic processing */
    gen_binary(OPC_MOD, discard, FALSE);
}